

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

void __thiscall iDynTree::AttitudeQuaternionEKF::serializeStateVector(AttitudeQuaternionEKF *this)

{
  double dVar1;
  double *pdVar2;
  size_t sVar3;
  
  pdVar2 = (double *)iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  sVar3 = iDynTree::VectorDynSize::size();
  if (sVar3 != this->m_state_size) {
    iDynTree::VectorDynSize::resize((ulong)&this->m_x);
  }
  dVar1 = (this->m_state_qekf).m_orientation.m_data[1];
  *pdVar2 = (this->m_state_qekf).m_orientation.m_data[0];
  pdVar2[1] = dVar1;
  dVar1 = (this->m_state_qekf).m_orientation.m_data[3];
  pdVar2[2] = (this->m_state_qekf).m_orientation.m_data[2];
  pdVar2[3] = dVar1;
  dVar1 = (this->m_state_qekf).m_angular_velocity.m_data[1];
  pdVar2[4] = (this->m_state_qekf).m_angular_velocity.m_data[0];
  pdVar2[5] = dVar1;
  pdVar2[6] = (this->m_state_qekf).m_angular_velocity.m_data[2];
  dVar1 = (this->m_state_qekf).m_gyroscope_bias.m_data[1];
  pdVar2[7] = (this->m_state_qekf).m_gyroscope_bias.m_data[0];
  pdVar2[8] = dVar1;
  pdVar2[9] = (this->m_state_qekf).m_gyroscope_bias.m_data[2];
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::serializeStateVector()
{
    using iDynTree::toEigen;
    auto x(toEigen(m_x));
    auto q(toEigen(m_state_qekf.m_orientation));
    auto Omega(toEigen(m_state_qekf.m_angular_velocity));
    auto b(toEigen(m_state_qekf.m_gyroscope_bias));

    if (m_x.size() != m_state_size)
    {
        m_x.resize(m_state_size);
    }

    x.block<4, 1>(0, 0) = q;
    x.block<3, 1>(4, 0) = Omega;
    x.block<3, 1>(7, 0) = b;
}